

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

void __thiscall
UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(reverse_lock *this)

{
  long lVar1;
  mutex *cs;
  char *pcVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  int nLine;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_lock<std::mutex>::swap(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  cs = (mutex *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  nLine = (int)((ulong)pcVar2 >> 0x20);
  uVar3 = *(undefined4 *)(in_RDI + 0x58);
  std::unique_lock<std::mutex>::mutex
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  EnterCritical<std::mutex>
            (in_RDI,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),nLine,cs,
             (bool)in_stack_ffffffffffffffcf);
  std::unique_lock<std::mutex>::lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  ~UniqueLock((UniqueLock<AnnotatedMixin<std::mutex>_> *)
              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~reverse_lock() {
            templock.swap(lock);
            EnterCritical(lockname.c_str(), file.c_str(), line, lock.mutex());
            lock.lock();
        }